

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

HighsStatus
assessBounds(HighsOptions *options,char *type,HighsInt ml_ix_os,
            HighsIndexCollection *index_collection,vector<double,_std::allocator<double>_> *lower,
            vector<double,_std::allocator<double>_> *upper,double infinite_bound,
            HighsVarType *integrality)

{
  pointer pdVar1;
  bool bVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  bool bVar4;
  byte bVar5;
  HighsStatus HVar6;
  int iVar7;
  HighsInt HVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  HighsLogOptions *log_options_;
  double dVar12;
  undefined8 in_XMM0_Qb;
  undefined4 uVar13;
  undefined4 uVar14;
  int local_a0;
  int local_98;
  HighsInt to_k;
  HighsIndexCollection *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  undefined1 local_48 [16];
  HighsInt from_k;
  
  local_50 = upper;
  limits(index_collection,&from_k,&to_k);
  HVar6 = kOk;
  if (from_k <= to_k) {
    lVar11 = (long)from_k;
    uVar14 = (undefined4)((ulong)-infinite_bound >> 0x20);
    log_options_ = &(options->super_HighsOptionsStruct).log_options;
    lVar10 = lVar11 << 0x20;
    iVar7 = -1;
    local_a0 = 0;
    local_98 = 0;
    bVar5 = 0;
    bVar2 = false;
    local_48._8_4_ = (int)in_XMM0_Qb;
    local_48._0_8_ = -infinite_bound;
    local_48._12_4_ = (uint)((ulong)in_XMM0_Qb >> 0x20) ^ 0x80000000;
    uVar13 = SUB84(infinite_bound,0);
    HVar8 = from_k;
    local_58 = index_collection;
    for (; lVar11 <= to_k; lVar11 = lVar11 + 1) {
      if (index_collection->is_interval_ == false) {
        iVar7 = HVar8;
        if ((index_collection->is_mask_ & 1U) != 0) {
          uVar9 = (int)lVar11 + ml_ix_os;
          goto LAB_0025c90c;
        }
        uVar9 = (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11] + ml_ix_os;
LAB_0025c932:
        bVar4 = highs_isInfinity(-(lower->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start[iVar7]);
        pvVar3 = local_50;
        if (!bVar4) {
          pdVar1 = (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (pdVar1[iVar7] <= (double)local_48._0_8_) {
            pdVar1[iVar7] = -INFINITY;
            local_a0 = local_a0 + 1;
          }
        }
        bVar4 = highs_isInfinity((local_50->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_start[iVar7]);
        pdVar1 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar12 = pdVar1[iVar7];
        uVar13 = SUB84(dVar12,0);
        uVar14 = (undefined4)((ulong)dVar12 >> 0x20);
        if ((!bVar4) && (infinite_bound <= dVar12)) {
          pdVar1[iVar7] = INFINITY;
          local_98 = local_98 + 1;
          uVar13 = 0;
          uVar14 = 0x7ff00000;
        }
        dVar12 = (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar7];
        if (((integrality == (HighsVarType *)0x0) ||
            ((integrality[iVar7] & ~kInteger) != kSemiContinuous)) &&
           ((double)CONCAT44(uVar14,uVar13) < dVar12)) {
          highsLogUser(log_options_,kWarning,"%3s  %12d has inconsistent bounds [%12g, %12g]\n",type
                       ,(ulong)uVar9);
          dVar12 = (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar7];
          bVar5 = 1;
        }
        if (infinite_bound <= dVar12) {
          highsLogUser(log_options_,kError,"%3s  %12d has lower bound of %12g >= %12g\n",dVar12,
                       SUB84(infinite_bound,0),type,(ulong)uVar9);
          bVar2 = true;
        }
        dVar12 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar7];
        index_collection = local_58;
        uVar13 = local_48._0_4_;
        uVar14 = local_48._4_4_;
        if (dVar12 <= local_48._0_8_) {
          highsLogUser(log_options_,kError,"%3s  %12d has upper bound of %12g <= %12g\n",dVar12,
                       local_48._0_4_,type,(ulong)uVar9);
          bVar2 = true;
          index_collection = local_58;
          uVar13 = local_48._0_4_;
          uVar14 = local_48._4_4_;
        }
      }
      else {
        iVar7 = iVar7 + 1;
        uVar9 = ml_ix_os + HVar8;
        if ((index_collection->is_mask_ & 1U) == 0) goto LAB_0025c932;
LAB_0025c90c:
        if (*(int *)((long)(index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start + (lVar10 >> 0x1e)) != 0)
        goto LAB_0025c932;
      }
      lVar10 = lVar10 + 0x100000000;
      HVar8 = HVar8 + 1;
    }
    if (local_a0 != 0) {
      highsLogUser(log_options_,kInfo,
                   "%3ss:%12d lower bounds    less than or equal to %12g are treated as -Infinity\n"
                   ,CONCAT44(uVar14,uVar13),type);
    }
    if (local_98 != 0) {
      highsLogUser(log_options_,kInfo,
                   "%3ss:%12d upper bounds greater than or equal to %12g are treated as +Infinity\n"
                   ,infinite_bound,type);
    }
    HVar6 = kError;
    if (!bVar2) {
      HVar6 = (HighsStatus)bVar5;
    }
  }
  return HVar6;
}

Assistant:

HighsStatus assessBounds(const HighsOptions& options, const char* type,
                         const HighsInt ml_ix_os,
                         const HighsIndexCollection& index_collection,
                         vector<double>& lower, vector<double>& upper,
                         const double infinite_bound,
                         const HighsVarType* integrality) {
  HighsStatus return_status = HighsStatus::kOk;
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return HighsStatus::kOk;

  return_status = HighsStatus::kOk;
  bool error_found = false;
  bool warning_found = false;
  // Work through the data to be assessed.
  //
  // Loop is k \in [from_k...to_k) covering the entries in the
  // interval, set or mask to be considered.
  //
  // For an interval or mask, these values of k are the row/column
  // indices to be considered in a local sense, as well as the entries
  // in the lower and upper bound data to be assessed
  //
  // For a set, these values of k are the indices in the set, from
  // which the indices to be considered in a local sense are
  // drawn. The entries in the lower and
  // upper bound data to be assessed correspond to the values of
  // k.
  //
  // Adding the value of ml_ix_os to local_ix yields the value of
  // ml_ix, being the index in a global (whole-model) sense. This is
  // necessary when assessing the bounds of rows/columns being added
  // to a model, since they are specified using an interval
  // [0...num_new_row/col) which must be offset by the current number
  // of rows/columns (generically indices) in the model.
  //
  HighsInt num_infinite_lower_bound = 0;
  HighsInt num_infinite_upper_bound = 0;
  HighsInt local_ix;
  HighsInt ml_ix;
  HighsInt usr_ix = -1;
  for (HighsInt k = from_k; k < to_k + 1; k++) {
    if (index_collection.is_interval_ || index_collection.is_mask_) {
      local_ix = k;
    } else {
      local_ix = index_collection.set_[k];
    }
    if (index_collection.is_interval_) {
      usr_ix++;
    } else {
      usr_ix = k;
    }
    ml_ix = ml_ix_os + local_ix;
    if (index_collection.is_mask_ && !index_collection.mask_[local_ix])
      continue;

    if (!highs_isInfinity(-lower[usr_ix])) {
      // Check whether a finite lower bound will be treated as -Infinity
      bool infinite_lower_bound = lower[usr_ix] <= -infinite_bound;
      if (infinite_lower_bound) {
        lower[usr_ix] = -kHighsInf;
        num_infinite_lower_bound++;
      }
    }
    if (!highs_isInfinity(upper[usr_ix])) {
      // Check whether a finite upper bound will be treated as Infinity
      bool infinite_upper_bound = upper[usr_ix] >= infinite_bound;
      if (infinite_upper_bound) {
        upper[usr_ix] = kHighsInf;
        num_infinite_upper_bound++;
      }
    }
    // Check that the lower bound does not exceed the upper bound
    bool legalLowerUpperBound = lower[usr_ix] <= upper[usr_ix];
    if (integrality) {
      // Legal for semi-variables to have inconsistent bounds
      if (integrality[usr_ix] == HighsVarType::kSemiContinuous ||
          integrality[usr_ix] == HighsVarType::kSemiInteger)
        legalLowerUpperBound = true;
    }
    if (!legalLowerUpperBound) {
      // Leave inconsistent bounds to be used to deduce infeasibility
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "%3s  %12" HIGHSINT_FORMAT
                   " has inconsistent bounds [%12g, %12g]\n",
                   type, ml_ix, lower[usr_ix], upper[usr_ix]);
      warning_found = true;
    }
    // Check that the lower bound is not as much as +Infinity
    bool legalLowerBound = lower[usr_ix] < infinite_bound;
    if (!legalLowerBound) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "%3s  %12" HIGHSINT_FORMAT
                   " has lower bound of %12g >= %12g\n",
                   type, ml_ix, lower[usr_ix], infinite_bound);
      error_found = true;
    }
    // Check that the upper bound is not as little as -Infinity
    bool legalUpperBound = upper[usr_ix] > -infinite_bound;
    if (!legalUpperBound) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "%3s  %12" HIGHSINT_FORMAT
                   " has upper bound of %12g <= %12g\n",
                   type, ml_ix, upper[usr_ix], -infinite_bound);
      error_found = true;
    }
  }
  if (num_infinite_lower_bound) {
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "%3ss:%12" HIGHSINT_FORMAT
                 " lower bounds    less than or equal to %12g are treated as "
                 "-Infinity\n",
                 type, num_infinite_lower_bound, -infinite_bound);
  }
  if (num_infinite_upper_bound) {
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "%3ss:%12" HIGHSINT_FORMAT
                 " upper bounds greater than or equal to %12g are treated as "
                 "+Infinity\n",
                 type, num_infinite_upper_bound, infinite_bound);
  }

  if (error_found)
    return_status = HighsStatus::kError;
  else if (warning_found)
    return_status = HighsStatus::kWarning;
  else
    return_status = HighsStatus::kOk;

  return return_status;
}